

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_functions.hh
# Opt level: O2

unsigned_long_long read_bits(uchar **p,size_t *bit_offset,size_t *bits_available,size_t bits_wanted)

{
  byte bVar1;
  size_t sVar2;
  unsigned_long_long uVar3;
  runtime_error *this;
  out_of_range *this_00;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  byte *pbVar7;
  string sStack_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*bits_available < bits_wanted) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_a8,bits_wanted);
    std::operator+(&local_88,"overflow reading bit stream: wanted = ",&local_a8);
    std::operator+(&local_68,&local_88,"; available = ");
    std::__cxx11::to_string(&sStack_c8,*bits_available);
    std::operator+(&local_48,&local_68,&sStack_c8);
    std::runtime_error::runtime_error(this,(string *)&local_48);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (bits_wanted < 0x21) {
    pbVar7 = *p;
    uVar3 = 0;
    for (; bits_wanted != 0; bits_wanted = bits_wanted - uVar4) {
      sVar2 = *bit_offset;
      bVar1 = *pbVar7;
      uVar5 = sVar2 + 1;
      uVar4 = bits_wanted;
      if (uVar5 < bits_wanted) {
        uVar4 = uVar5;
      }
      if (bits_wanted < uVar5) {
        sVar6 = (uVar5 - uVar4) - 1;
      }
      else {
        pbVar7 = pbVar7 + 1;
        *p = pbVar7;
        sVar6 = 7;
      }
      uVar3 = uVar3 << ((byte)uVar4 & 0x3f) |
              (ulong)(byte)((~(byte)(-1 << ((char)sVar2 + 1U & 0x1f)) & bVar1) >>
                           ((byte)(uVar5 - uVar4) & 0x1f));
      *bit_offset = sVar6;
      *bits_available = *bits_available - uVar4;
    }
    return uVar3;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"read_bits: too many bits requested");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

static unsigned long long
read_bits(unsigned char const*& p, size_t& bit_offset, size_t& bits_available, size_t bits_wanted)
{
    // View p as a stream of bits:

    // 76543210 76543210 ....

    // bit_offset is the bit number within the first byte that marks
    // the first bit that we would read.

    if (bits_wanted > bits_available) {
        throw std::runtime_error(
            "overflow reading bit stream: wanted = " + std::to_string(bits_wanted) +
            "; available = " + std::to_string(bits_available));
    }
    if (bits_wanted > 32) {
        throw std::out_of_range("read_bits: too many bits requested");
    }

    unsigned long result = 0;
# ifdef BITS_TESTING
    if (bits_wanted == 0) {
        QTC::TC("libtests", "bits zero bits wanted");
    }
# endif
    while (bits_wanted > 0) {
        // Grab bits from the first byte clearing anything before
        // bit_offset.
        unsigned char byte = static_cast<unsigned char>(*p & ((1U << (bit_offset + 1U)) - 1U));

        // There are bit_offset + 1 bits available in the first byte.
        size_t to_copy = std::min(bits_wanted, bit_offset + 1);
        size_t leftover = (bit_offset + 1) - to_copy;

# ifdef BITS_TESTING
        QTC::TC("libtests", "bits bit_offset", ((bit_offset == 0) ? 0 : (bit_offset == 7) ? 1 : 2));
        QTC::TC("libtests", "bits leftover", (leftover > 0) ? 1 : 0);
# endif

        // Right shift so that all the bits we want are right justified.
        byte = static_cast<unsigned char>(byte >> leftover);

        // Copy the bits into result
        result <<= to_copy;
        result |= byte;

        // Update pointers
        if (leftover) {
            bit_offset = leftover - 1;
        } else {
            bit_offset = 7;
            ++p;
        }
        bits_wanted -= to_copy;
        bits_available -= to_copy;

# ifdef BITS_TESTING
        QTC::TC("libtests", "bits iterations", ((bits_wanted > 8) ? 0 : (bits_wanted > 0) ? 1 : 2));
# endif
    }

    return result;
}